

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids::~IfcFacetedBrepWithVoids
          (IfcFacetedBrepWithVoids *this,void **vtt)

{
  void **vtt_local;
  IfcFacetedBrepWithVoids *this_local;
  
  (this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[0xfffffffffffffffd]) = vtt[0x19];
  *(void **)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
             super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x1a];
  *(void **)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
             super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x1b];
  *(void **)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
             super_IfcGeometricRepresentationItem.field_0x30 = vtt[0x1c];
  *(void **)&(this->super_IfcManifoldSolidBrep).field_0x48 = vtt[0x1d];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcClosedShell>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcClosedShell>,_1UL,_0UL> *)
             &(this->super_IfcManifoldSolidBrep).field_0x58);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids,_1UL> *)
             &(this->super_IfcManifoldSolidBrep).field_0x48,vtt + 0x17);
  IfcManifoldSolidBrep::~IfcManifoldSolidBrep(&this->super_IfcManifoldSolidBrep,vtt + 1);
  return;
}

Assistant:

IfcFacetedBrepWithVoids() : Object("IfcFacetedBrepWithVoids") {}